

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

void tinygltf::SerializeGltfNormalTextureInfo(NormalTextureInfo *texinfo,json *o)

{
  char cVar1;
  allocator local_c1;
  string local_c0;
  allocator local_99;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  json *local_18;
  json *o_local;
  NormalTextureInfo *texinfo_local;
  
  local_18 = o;
  o_local = (json *)texinfo;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"index",&local_39);
  SerializeNumberProperty<int>(&local_38,*(int *)o_local,local_18);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (*(int *)&o_local->field_0x4 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_70,"texCoord",&local_71);
    SerializeNumberProperty<int>(&local_70,*(int *)&o_local->field_0x4,local_18);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  if (1e-12 <= ABS(1.0 - (o_local->m_value).number_float)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_98,"scale",&local_99);
    SerializeNumberProperty<double>(&local_98,(o_local->m_value).number_float,local_18);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
  }
  cVar1 = Value::Type((Value *)(o_local + 1));
  if (cVar1 != '\0') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c0,"extras",&local_c1);
    SerializeValue(&local_c0,(Value *)(o_local + 1),local_18);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  }
  SerializeExtensionMap((ExtensionMap *)&o_local[10].m_value,local_18);
  return;
}

Assistant:

static void SerializeGltfNormalTextureInfo(NormalTextureInfo &texinfo,
                                           json &o) {
  SerializeNumberProperty("index", texinfo.index, o);

  if (texinfo.texCoord != 0) {
    SerializeNumberProperty("texCoord", texinfo.texCoord, o);
  }

  if (!TINYGLTF_DOUBLE_EQUAL(texinfo.scale, 1.0)) {
    SerializeNumberProperty("scale", texinfo.scale, o);
  }

  if (texinfo.extras.Type() != NULL_TYPE) {
    SerializeValue("extras", texinfo.extras, o);
  }

  SerializeExtensionMap(texinfo.extensions, o);
}